

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall
Minisat::Int64Option::fillGranularityDomain
          (Int64Option *this,int granularity,vector<long,_std::allocator<long>_> *values)

{
  pointer plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong __new_size;
  uint uVar6;
  
  std::vector<long,_std::allocator<long>_>::resize(values,(long)granularity);
  plVar1 = (values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  *plVar1 = this->value;
  lVar4 = 0x200;
  if (this->value < 16000) {
    lVar4 = 0x40;
  }
  lVar3 = 1;
  if (0xf < this->value) {
    lVar3 = lVar4;
  }
  uVar6 = 1;
  if (1 < granularity) {
    plVar1[1] = this->defaultValue;
    uVar6 = 2;
  }
  do {
    lVar4 = lVar3;
    if (granularity <= (int)uVar6) break;
    if ((lVar4 != 0) && (lVar3 = this->value + lVar4, lVar3 <= (this->range).end)) {
      lVar5 = (long)(int)uVar6;
      uVar6 = uVar6 + 1;
      plVar1[lVar5] = lVar3;
    }
    if (((int)uVar6 < granularity) && (lVar3 = this->value - lVar4, (this->range).begin <= lVar3)) {
      lVar5 = (long)(int)uVar6;
      uVar6 = uVar6 + 1;
      plVar1[lVar5] = lVar3;
    }
    lVar3 = lVar4 * 4;
  } while ((lVar4 < 1) ||
          ((this->range).begin <= this->value + lVar4 * -4 ||
           this->value + lVar3 <= (this->range).end));
  std::vector<long,_std::allocator<long>_>::resize(values,(long)(int)uVar6);
  plVar1 = (values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  sort<long,Minisat::LessThan_default<long>>
            (plVar1,(ulong)((long)(values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)plVar1) >> 3);
  __new_size = 1;
  if (1 < (int)uVar6) {
    plVar1 = (values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = 0;
    do {
      if (plVar1[__new_size] != plVar1[iVar2]) {
        plVar1[(long)iVar2 + 1] = plVar1[__new_size];
        iVar2 = iVar2 + 1;
      }
      __new_size = __new_size + 1;
    } while (uVar6 != __new_size);
    __new_size = (ulong)(iVar2 + 1);
  }
  std::vector<long,_std::allocator<long>_>::resize(values,__new_size);
  return;
}

Assistant:

void fillGranularityDomain(int granularity, std::vector<int64_t> &values)
    {
        values.resize(granularity);
        int addedValues = 0;
        values[addedValues++] = value;
        int64_t dist = value < 16 ? 1 : (value < 16000 ? 64 : 512); // smarter way to initialize the initial diff value
        if (addedValues < granularity) {
            values[addedValues++] = defaultValue;
        }
        while (addedValues < granularity) {
            if (value + dist > value && value + dist <= range.end) {
                values[addedValues++] = value + dist;
            }
            if (addedValues < granularity && value - dist >= range.begin) {
                values[addedValues++] = value - dist;
            }
            dist = dist * 4;
            if (value - dist < value && value + dist > range.end && value - dist < range.begin) {
                break;
            } // stop if there cannot be more values!
        }
        values.resize(addedValues);
        sort(values);
        int j = 0;
        assert(values[0] >= range.begin && values[0] <= range.end && "stay in bound");
        for (int i = 1; i < addedValues; ++i) {
            if (values[i] != values[j]) {
                assert(values[i] >= range.begin && values[i] <= range.end && "stay in bound");
                values[++j] = values[i];
            }
        }
        j++;
        assert(addedValues > 0 && "there has to be at least one option");
        assert(j <= addedValues && j <= granularity && "collected values hae to stay in bounds");
        values.resize(j);
    }